

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O0

int g2d_polygon_contains_point_ref(zarray_t *poly,double *q)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double this_theta;
  double p [2];
  double dStack_30;
  int i;
  double last_theta;
  double acc_theta;
  int psz;
  double *q_local;
  zarray_t *poly_local;
  
  iVar1 = zarray_size(poly);
  last_theta = 0.0;
  for (p[1]._4_4_ = 0; p[1]._4_4_ <= iVar1; p[1]._4_4_ = p[1]._4_4_ + 1) {
    zarray_get(poly,p[1]._4_4_ % iVar1,&this_theta);
    dVar2 = atan2(q[1] - p[0],*q - this_theta);
    if (p[1]._4_4_ != 0) {
      dVar3 = mod2pi(dVar2 - dStack_30);
      last_theta = dVar3 + last_theta;
    }
    dStack_30 = dVar2;
  }
  return (int)(3.141592653589793 < last_theta);
}

Assistant:

int g2d_polygon_contains_point_ref(const zarray_t *poly, double q[2])
{
    // use winding. If the point is inside the polygon, we'll wrap
    // around it (accumulating 6.28 radians). If we're outside the
    // polygon, we'll accumulate zero.
    int psz = zarray_size(poly);

    double acc_theta = 0;

    double last_theta;

    for (int i = 0; i <= psz; i++) {
        double p[2];

        zarray_get(poly, i % psz, &p);

        double this_theta = atan2(q[1]-p[1], q[0]-p[0]);

        if (i != 0)
            acc_theta += mod2pi(this_theta - last_theta);

        last_theta = this_theta;
    }

    return acc_theta > M_PI;
}